

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
::~BaseDictionary(BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
                  *this)

{
  if (this->buckets != (int *)0x0) {
    DeleteBuckets(this,this->buckets,this->bucketCount);
  }
  if (this->entries != (EntryType *)0x0) {
    DeleteEntries(this,this->entries,this->size);
  }
  CCLock::~CCLock((CCLock *)this);
  return;
}

Assistant:

~BaseDictionary()
        {
            if (buckets)
            {
                DeleteBuckets(buckets, bucketCount);
            }

            if (entries)
            {
                DeleteEntries(entries, size);
            }
        }